

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

bool tinyusdz::value::RoleTypeCast(uint32_t roleTyId,Value *inout)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  texcoord2h *ptVar4;
  value_type *__x;
  array<tinyusdz::value::half,_2UL> *__src;
  value_type *pvVar5;
  value_type *__x_00;
  texcoord2f *__dest;
  array<float,_2UL> *__src_00;
  value_type *pvVar6;
  value_type *__x_01;
  texcoord2d *__dest_00;
  array<double,_2UL> *__src_01;
  texcoord3h *__dest_01;
  texcoord3f *__dest_02;
  texcoord3d *__dest_03;
  normal3h *__dest_04;
  normal3f *__dest_05;
  normal3d *__dest_06;
  vector3h *__dest_07;
  vector3f *__dest_08;
  vector3d *__dest_09;
  point3h *__dest_10;
  point3f *__dest_11;
  point3d *__dest_12;
  value_type *pvVar7;
  value_type *pvVar8;
  color3h *__dest_13;
  array<tinyusdz::value::half,_3UL> *paVar9;
  value_type *pvVar10;
  value_type *pvVar11;
  color3f *__dest_14;
  array<float,_3UL> *paVar12;
  value_type *pvVar13;
  value_type *pvVar14;
  color3d *__dest_15;
  array<double,_3UL> *paVar15;
  value_type *pvVar16;
  value_type *__x_02;
  color4h *__dest_16;
  array<tinyusdz::value::half,_4UL> *__src_02;
  value_type *pvVar17;
  value_type *__x_03;
  color4f *__dest_17;
  array<float,_4UL> *__src_03;
  value_type *pvVar18;
  value_type *__x_04;
  color4d *__dest_18;
  array<double,_4UL> *__src_04;
  value_type *__src_05;
  value_type *__x_05;
  size_type sVar19;
  frame4d *__dest_19;
  matrix4d *__src_06;
  undefined1 local_1148 [8];
  vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_> newval_43;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> val_43;
  undefined1 local_10f8 [8];
  optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  pv_43;
  frame4d newval_42;
  matrix4d val_42;
  undefined1 local_f50 [8];
  optional<tinyusdz::value::matrix4d> pv_42;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> newval_41;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> val_41;
  undefined1 local_e78 [8];
  optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_> pv_41;
  color4d newval_40;
  double4 val_40;
  undefined1 local_df0 [8];
  optional<std::array<double,_4UL>_> pv_40;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> newval_39;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> val_39;
  undefined1 local_d78 [8];
  optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_> pv_39;
  color4f newval_38;
  float4 val_38;
  undefined1 local_d24 [8];
  optional<std::array<float,_4UL>_> pv_38;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> newval_37;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  val_37;
  undefined1 local_cc0 [8];
  optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
  pv_37;
  color4h newval_36;
  half4 val_36;
  undefined1 local_c82 [8];
  optional<std::array<tinyusdz::value::half,_4UL>_> pv_36;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> newval_35;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> val_35;
  undefined1 local_c28 [8];
  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_> pv_35;
  color3d newval_34;
  double3 val_34;
  undefined1 local_bb8 [8];
  optional<std::array<double,_3UL>_> pv_34;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> newval_33;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> val_33;
  undefined1 local_b48 [8];
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> pv_33;
  color3f newval_32;
  float3 val_32;
  undefined1 local_b00 [8];
  optional<std::array<float,_3UL>_> pv_32;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> newval_31;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  val_31;
  undefined1 local_aa0 [8];
  optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  pv_31;
  color3h newval_30;
  half3 val_30;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_a68;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv_30;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> newval_29;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> val_29;
  undefined1 local_a10 [8];
  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_> pv_29;
  point3d newval_28;
  double3 val_28;
  undefined1 local_9a0 [8];
  optional<std::array<double,_3UL>_> pv_28;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> newval_27;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> val_27;
  undefined1 local_930 [8];
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> pv_27;
  point3f newval_26;
  float3 val_26;
  undefined1 local_8e8 [8];
  optional<std::array<float,_3UL>_> pv_26;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> newval_25;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  val_25;
  undefined1 local_888 [8];
  optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  pv_25;
  point3h newval_24;
  half3 val_24;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_850;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv_24;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> newval_23;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> val_23;
  undefined1 local_7f8 [8];
  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_> pv_23;
  vector3d newval_22;
  double3 val_22;
  undefined1 local_788 [8];
  optional<std::array<double,_3UL>_> pv_22;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> newval_21;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> val_21;
  undefined1 local_718 [8];
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> pv_21;
  vector3f newval_20;
  float3 val_20;
  undefined1 local_6d0 [8];
  optional<std::array<float,_3UL>_> pv_20;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> newval_19;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  val_19;
  undefined1 local_670 [8];
  optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  pv_19;
  vector3h newval_18;
  half3 val_18;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_638;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv_18;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> newval_17;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> val_17;
  undefined1 local_5e0 [8];
  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_> pv_17;
  normal3d newval_16;
  double3 val_16;
  undefined1 local_570 [8];
  optional<std::array<double,_3UL>_> pv_16;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> newval_15;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> val_15;
  undefined1 local_500 [8];
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> pv_15;
  normal3f newval_14;
  float3 val_14;
  undefined1 local_4b8 [8];
  optional<std::array<float,_3UL>_> pv_14;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> newval_13;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  val_13;
  undefined1 local_458 [8];
  optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  pv_13;
  normal3h newval_12;
  half3 val_12;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_420;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv_12;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> newval_11;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> val_11;
  undefined1 local_3c8 [8];
  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_> pv_11;
  texcoord3d newval_10;
  double3 val_10;
  undefined1 local_358 [8];
  optional<std::array<double,_3UL>_> pv_10;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> newval_9;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> val_9;
  undefined1 local_2e8 [8];
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> pv_9;
  texcoord3f newval_8;
  float3 val_8;
  undefined1 local_2a0 [8];
  optional<std::array<float,_3UL>_> pv_8;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> newval_7;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  val_7;
  undefined1 local_240 [8];
  optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  pv_7;
  texcoord3h newval_6;
  half3 val_6;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_208;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv_6;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> newval_5;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> val_5;
  undefined1 local_1b0 [8];
  optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_> pv_5;
  texcoord2d newval_4;
  double2 val_4;
  undefined1 local_158 [8];
  optional<std::array<double,_2UL>_> pv_4;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> newval_3;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> val_3;
  undefined1 local_f0 [8];
  optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_> pv_3;
  texcoord2f newval_2;
  float2 val_2;
  undefined1 local_b4 [8];
  optional<std::array<float,_2UL>_> pv_2;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> newval_1;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  val_1;
  undefined1 local_58 [8];
  optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
  pv_1;
  texcoord2h local_30;
  texcoord2h local_2c;
  texcoord2h newval;
  half2 val;
  optional<std::array<tinyusdz::value::half,_2UL>_> pv;
  uint32_t srcUnderlyingTyId;
  Value *inout_local;
  uint32_t roleTyId_local;
  
  uVar2 = Value::underlying_type_id(inout);
  uVar3 = TypeTraits<std::array<tinyusdz::value::half,_2UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::texcoord2h>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<tinyusdz::value::half,2ul>>
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)&newval,inout,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::
      optional<std::array<tinyusdz::value::half,_2UL>,_0>
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)(val._M_elems + 1),
                 (optional<std::array<tinyusdz::value::half,_2UL>_> *)&newval);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)&newval);
      pv_1.contained._20_1_ =
           nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(val._M_elems + 1));
      if ((bool)pv_1.contained._20_1_) {
        ptVar4 = (texcoord2h *)
                 nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::value
                           ((optional<std::array<tinyusdz::value::half,_2UL>_> *)(val._M_elems + 1))
        ;
        local_30 = *ptVar4;
        local_2c = local_30;
        Value::operator=(inout,&local_30);
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)(val._M_elems + 1));
joined_r0x003b951f:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<tinyusdz::value::half,_2UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::
      get_value<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                ((optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
                  *)&val_1.
                     super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
      ::
      optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>,_0>
                ((optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
                  *)local_58,
                 (optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
                  *)&val_1.
                     super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
                   *)&val_1.
                      super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_58);
      if (bVar1) {
        __x = nonstd::optional_lite::
              optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
              ::value((optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
                       *)local_58);
        ::std::
        vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)&newval_1.
                     super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
        ::std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *)
               &pv_2.contained);
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                         *)&newval_1.
                            super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        resize((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *)
               &pv_2.contained,sVar19);
        ptVar4 = ::std::
                 vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
                 data((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)&pv_2.contained);
        __src = ::std::
                vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                ::data((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                        *)&newval_1.
                           super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                         *)&newval_1.
                            super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(ptVar4,__src,sVar19 << 2);
        Value::operator=(inout,(vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                *)&pv_2.contained);
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        ~vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *
                )&pv_2.contained);
        ::std::
        vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                   *)&newval_1.
                      super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
                   *)local_58);
      goto joined_r0x003b951f;
    }
  }
  uVar3 = TypeTraits<std::array<float,_2UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::texcoord2f>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<float,2ul>>
                ((optional<std::array<float,_2UL>_> *)&val_2,inout,false);
      nonstd::optional_lite::optional<std::array<float,_2UL>_>::optional<std::array<float,_2UL>,_0>
                ((optional<std::array<float,_2UL>_> *)local_b4,
                 (optional<std::array<float,_2UL>_> *)&val_2);
      nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional
                ((optional<std::array<float,_2UL>_> *)&val_2);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_b4);
      if (bVar1) {
        pvVar5 = nonstd::optional_lite::optional<std::array<float,_2UL>_>::value
                           ((optional<std::array<float,_2UL>_> *)local_b4);
        pv_3.contained._16_8_ = *(undefined8 *)pvVar5->_M_elems;
        Value::operator=(inout,(texcoord2f *)((long)&pv_3.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional
                ((optional<std::array<float,_2UL>_> *)local_b4);
joined_r0x003b9779:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<float,_2UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                ((optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                  *)&val_3.
                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>::
      optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_0>
                ((optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                  *)local_f0,
                 (optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                  *)&val_3.
                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                 *)&val_3.
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_f0);
      if (bVar1) {
        __x_00 = nonstd::optional_lite::
                 optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                 ::value((optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                          *)local_f0);
        ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &newval_3.
                    super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x_00);
        ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
               ((long)&pv_4.contained + 8));
        sVar19 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                 size((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                      &newval_3.
                       super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        resize((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
               ((long)&pv_4.contained + 8),sVar19);
        __dest = ::std::
                 vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
                 data((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)((long)&pv_4.contained + 8));
        __src_00 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                   data((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                        &newval_3.
                         super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                 size((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                      &newval_3.
                       super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest,__src_00,sVar19 << 3);
        Value::operator=(inout,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                *)((long)&pv_4.contained + 8));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        ~vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *
                )((long)&pv_4.contained + 8));
        ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &newval_3.
                    super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                 *)local_f0);
      goto joined_r0x003b9779;
    }
  }
  uVar3 = TypeTraits<std::array<double,_2UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::texcoord2d>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<double,2ul>>
                ((optional<std::array<double,_2UL>_> *)(val_4._M_elems + 1),inout,false);
      nonstd::optional_lite::optional<std::array<double,_2UL>_>::
      optional<std::array<double,_2UL>,_0>
                ((optional<std::array<double,_2UL>_> *)local_158,
                 (optional<std::array<double,_2UL>_> *)(val_4._M_elems + 1));
      nonstd::optional_lite::optional<std::array<double,_2UL>_>::~optional
                ((optional<std::array<double,_2UL>_> *)(val_4._M_elems + 1));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_158);
      if (bVar1) {
        pvVar6 = nonstd::optional_lite::optional<std::array<double,_2UL>_>::value
                           ((optional<std::array<double,_2UL>_> *)local_158);
        pv_5.contained._16_8_ = pvVar6->_M_elems[0];
        val_4._M_elems[0] = pvVar6->_M_elems[1];
        Value::operator=(inout,(texcoord2d *)((long)&pv_5.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<double,_2UL>_>::~optional
                ((optional<std::array<double,_2UL>_> *)local_158);
joined_r0x003b99ec:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<double,_2UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                ((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                  *)&val_5.
                     super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::
      optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_0>
                ((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                  *)local_1b0,
                 (optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                  *)&val_5.
                     super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                 *)&val_5.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1b0);
      if (bVar1) {
        __x_01 = nonstd::optional_lite::
                 optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                 ::value((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                          *)local_1b0);
        ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &newval_5.
                    super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x_01);
        ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)
               &pv_6);
        sVar19 = ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                 size((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                      &newval_5.
                       super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        resize((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)
               &pv_6,sVar19);
        __dest_00 = ::std::
                    vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    ::data((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                            *)&pv_6);
        __src_01 = ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   ::data((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                           *)&newval_5.
                              super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                 size((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                      &newval_5.
                       super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_00,__src_01,sVar19 << 4);
        Value::operator=(inout,(vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                *)&pv_6);
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        ~vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *
                )&pv_6);
        ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &newval_5.
                    super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                 *)local_1b0);
      goto joined_r0x003b99ec;
    }
  }
  uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::texcoord3h>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_6.r,inout,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>
                (&local_208,(optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_6.r);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_6.r);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_208);
      if (bVar1) {
        pvVar7 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_208);
        pv_7.contained._20_4_ = *(undefined4 *)pvVar7->_M_elems;
        newval_6.t.value = pvVar7->_M_elems[2].value;
        Value::operator=(inout,(texcoord3h *)((long)&pv_7.contained + 0x14));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_208);
joined_r0x003b9c58:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::
      get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_7.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)local_240,
                 (optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_7.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)&val_7.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_240);
      if (bVar1) {
        pvVar8 = nonstd::optional_lite::
                 optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                 ::value((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)local_240);
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&newval_7.
                     super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8);
        ::std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *)
               ((long)&pv_8.contained + 4));
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_7.
                            super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        resize((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *)
               ((long)&pv_8.contained + 4),sVar19);
        __dest_01 = ::std::
                    vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                    ::data((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                            *)((long)&pv_8.contained + 4));
        paVar9 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::data((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_7.
                            super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_7.
                            super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_01,paVar9,sVar19 * 6);
        Value::operator=(inout,(vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                *)((long)&pv_8.contained + 4));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        ~vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *
                )((long)&pv_8.contained + 4));
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)&newval_7.
                      super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)local_240);
      goto joined_r0x003b9c58;
    }
  }
  uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::texcoord3f>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<float,3ul>>
                ((optional<std::array<float,_3UL>_> *)(val_8._M_elems + 1),inout,false);
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::optional<std::array<float,_3UL>,_0>
                ((optional<std::array<float,_3UL>_> *)local_2a0,
                 (optional<std::array<float,_3UL>_> *)(val_8._M_elems + 1));
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)(val_8._M_elems + 1));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2a0);
      if (bVar1) {
        pvVar10 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                            ((optional<std::array<float,_3UL>_> *)local_2a0);
        pv_9.contained._16_8_ = *(undefined8 *)pvVar10->_M_elems;
        val_8._M_elems[0] = pvVar10->_M_elems[2];
        Value::operator=(inout,(texcoord3f *)((long)&pv_9.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)local_2a0);
joined_r0x003b9ec4:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_9.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)local_2e8,
                 (optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_9.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)&val_9.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2e8);
      if (bVar1) {
        pvVar11 = nonstd::optional_lite::
                  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           *)local_2e8);
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_9.
                    super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11);
        ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
               ((long)&pv_10.contained + 0x10));
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_9.
                       super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        resize((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
               ((long)&pv_10.contained + 0x10),sVar19);
        __dest_02 = ::std::
                    vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    ::data((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                            *)((long)&pv_10.contained + 0x10));
        paVar12 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &newval_9.
                        super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_9.
                       super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_02,paVar12,sVar19 * 0xc);
        Value::operator=(inout,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                *)((long)&pv_10.contained + 0x10));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        ~vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *
                )((long)&pv_10.contained + 0x10));
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_9.
                    super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)local_2e8);
      goto joined_r0x003b9ec4;
    }
  }
  uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::texcoord3d>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<double,3ul>>
                ((optional<std::array<double,_3UL>_> *)(val_10._M_elems + 2),inout,false);
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::
      optional<std::array<double,_3UL>,_0>
                ((optional<std::array<double,_3UL>_> *)local_358,
                 (optional<std::array<double,_3UL>_> *)(val_10._M_elems + 2));
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)(val_10._M_elems + 2));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_358);
      if (bVar1) {
        pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                            ((optional<std::array<double,_3UL>_> *)local_358);
        pv_11.contained._16_8_ = pvVar13->_M_elems[0];
        val_10._M_elems[0] = pvVar13->_M_elems[1];
        val_10._M_elems[1] = pvVar13->_M_elems[2];
        Value::operator=(inout,(texcoord3d *)((long)&pv_11.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)local_358);
joined_r0x003ba14d:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_11.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)local_3c8,
                 (optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_11.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)&val_11.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_3c8);
      if (bVar1) {
        pvVar14 = nonstd::optional_lite::
                  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                           *)local_3c8);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_11.
                    super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar14);
        ::std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *)
               &pv_12);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_11.
                       super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        resize((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *)
               &pv_12,sVar19);
        __dest_03 = ::std::
                    vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    ::data((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                            *)&pv_12);
        paVar15 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ::data((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          *)&newval_11.
                             super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_11.
                       super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_03,paVar15,sVar19 * 0x18);
        Value::operator=(inout,(vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                *)&pv_12);
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        ~vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *
                )&pv_12);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_11.
                    super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)local_3c8);
      goto joined_r0x003ba14d;
    }
  }
  uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::normal3h>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_12.z,inout,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>
                (&local_420,(optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_12.z);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_12.z);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_420);
      if (bVar1) {
        pvVar7 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_420);
        pv_13.contained._20_4_ = *(undefined4 *)pvVar7->_M_elems;
        newval_12.y.value = pvVar7->_M_elems[2].value;
        Value::operator=(inout,(normal3h *)((long)&pv_13.contained + 0x14));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_420);
joined_r0x003ba3b9:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::
      get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_13.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)local_458,
                 (optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_13.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)&val_13.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_458);
      if (bVar1) {
        pvVar8 = nonstd::optional_lite::
                 optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                 ::value((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)local_458);
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&newval_13.
                     super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8);
        ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::vector
                  ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   ((long)&pv_14.contained + 4));
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_13.
                            super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::resize
                  ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   ((long)&pv_14.contained + 4),sVar19);
        __dest_04 = ::std::
                    vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
                    data((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                          *)((long)&pv_14.contained + 4));
        paVar9 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::data((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_13.
                            super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_13.
                            super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_04,paVar9,sVar19 * 6);
        Value::operator=(inout,(vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                *)((long)&pv_14.contained + 4));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
        ~vector((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                ((long)&pv_14.contained + 4));
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)&newval_13.
                      super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)local_458);
      goto joined_r0x003ba3b9;
    }
  }
  uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::normal3f>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<float,3ul>>
                ((optional<std::array<float,_3UL>_> *)(val_14._M_elems + 1),inout,false);
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::optional<std::array<float,_3UL>,_0>
                ((optional<std::array<float,_3UL>_> *)local_4b8,
                 (optional<std::array<float,_3UL>_> *)(val_14._M_elems + 1));
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)(val_14._M_elems + 1));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_4b8);
      if (bVar1) {
        pvVar10 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                            ((optional<std::array<float,_3UL>_> *)local_4b8);
        pv_15.contained._16_8_ = *(undefined8 *)pvVar10->_M_elems;
        val_14._M_elems[0] = pvVar10->_M_elems[2];
        Value::operator=(inout,(normal3f *)((long)&pv_15.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)local_4b8);
joined_r0x003ba625:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_15.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)local_500,
                 (optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_15.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)&val_15.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_500);
      if (bVar1) {
        pvVar11 = nonstd::optional_lite::
                  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           *)local_500);
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_15.
                    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11);
        ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
                  ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   ((long)&pv_16.contained + 0x10));
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_15.
                       super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::resize
                  ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   ((long)&pv_16.contained + 0x10),sVar19);
        __dest_05 = ::std::
                    vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
                    data((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          *)((long)&pv_16.contained + 0x10));
        paVar12 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &newval_15.
                        super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_15.
                       super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_05,paVar12,sVar19 * 0xc);
        Value::operator=(inout,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                *)((long)&pv_16.contained + 0x10));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
        ~vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                ((long)&pv_16.contained + 0x10));
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_15.
                    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)local_500);
      goto joined_r0x003ba625;
    }
  }
  uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::normal3d>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<double,3ul>>
                ((optional<std::array<double,_3UL>_> *)(val_16._M_elems + 2),inout,false);
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::
      optional<std::array<double,_3UL>,_0>
                ((optional<std::array<double,_3UL>_> *)local_570,
                 (optional<std::array<double,_3UL>_> *)(val_16._M_elems + 2));
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)(val_16._M_elems + 2));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_570);
      if (bVar1) {
        pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                            ((optional<std::array<double,_3UL>_> *)local_570);
        pv_17.contained._16_8_ = pvVar13->_M_elems[0];
        val_16._M_elems[0] = pvVar13->_M_elems[1];
        val_16._M_elems[1] = pvVar13->_M_elems[2];
        Value::operator=(inout,(normal3d *)((long)&pv_17.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)local_570);
joined_r0x003ba8ae:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_17.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)local_5e0,
                 (optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_17.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)&val_17.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_5e0);
      if (bVar1) {
        pvVar14 = nonstd::optional_lite::
                  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                           *)local_5e0);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_17.
                    super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar14);
        ::std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::vector
                  ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &pv_18);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_17.
                       super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::resize
                  ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &pv_18,sVar19);
        __dest_06 = ::std::
                    vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
                    data((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                          *)&pv_18);
        paVar15 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ::data((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          *)&newval_17.
                             super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_17.
                       super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_06,paVar15,sVar19 * 0x18);
        Value::operator=(inout,(vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                *)&pv_18);
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
        ~vector((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                &pv_18);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_17.
                    super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)local_5e0);
      goto joined_r0x003ba8ae;
    }
  }
  uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::vector3h>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_18.z,inout,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>
                (&local_638,(optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_18.z);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_18.z);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_638);
      if (bVar1) {
        pvVar7 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_638);
        pv_19.contained._20_4_ = *(undefined4 *)pvVar7->_M_elems;
        newval_18.y.value = pvVar7->_M_elems[2].value;
        Value::operator=(inout,(vector3h *)((long)&pv_19.contained + 0x14));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_638);
joined_r0x003bab1a:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::
      get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_19.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)local_670,
                 (optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_19.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)&val_19.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_670);
      if (bVar1) {
        pvVar8 = nonstd::optional_lite::
                 optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                 ::value((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)local_670);
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&newval_19.
                     super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8);
        ::std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::vector
                  ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   ((long)&pv_20.contained + 4));
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_19.
                            super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::resize
                  ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   ((long)&pv_20.contained + 4),sVar19);
        __dest_07 = ::std::
                    vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
                    data((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                          *)((long)&pv_20.contained + 4));
        paVar9 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::data((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_19.
                            super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_19.
                            super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_07,paVar9,sVar19 * 6);
        Value::operator=(inout,(vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                *)((long)&pv_20.contained + 4));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
        ~vector((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                ((long)&pv_20.contained + 4));
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)&newval_19.
                      super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)local_670);
      goto joined_r0x003bab1a;
    }
  }
  uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::vector3f>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<float,3ul>>
                ((optional<std::array<float,_3UL>_> *)(val_20._M_elems + 1),inout,false);
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::optional<std::array<float,_3UL>,_0>
                ((optional<std::array<float,_3UL>_> *)local_6d0,
                 (optional<std::array<float,_3UL>_> *)(val_20._M_elems + 1));
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)(val_20._M_elems + 1));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_6d0);
      if (bVar1) {
        pvVar10 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                            ((optional<std::array<float,_3UL>_> *)local_6d0);
        pv_21.contained._16_8_ = *(undefined8 *)pvVar10->_M_elems;
        val_20._M_elems[0] = pvVar10->_M_elems[2];
        Value::operator=(inout,(vector3f *)((long)&pv_21.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)local_6d0);
joined_r0x003bad86:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_21.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)local_718,
                 (optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_21.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)&val_21.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_718);
      if (bVar1) {
        pvVar11 = nonstd::optional_lite::
                  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           *)local_718);
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_21.
                    super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11);
        ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::vector
                  ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   ((long)&pv_22.contained + 0x10));
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_21.
                       super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::resize
                  ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   ((long)&pv_22.contained + 0x10),sVar19);
        __dest_08 = ::std::
                    vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
                    data((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                          *)((long)&pv_22.contained + 0x10));
        paVar12 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &newval_21.
                        super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_21.
                       super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_08,paVar12,sVar19 * 0xc);
        Value::operator=(inout,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                *)((long)&pv_22.contained + 0x10));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
        ~vector((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                ((long)&pv_22.contained + 0x10));
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_21.
                    super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)local_718);
      goto joined_r0x003bad86;
    }
  }
  uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::vector3d>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<double,3ul>>
                ((optional<std::array<double,_3UL>_> *)(val_22._M_elems + 2),inout,false);
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::
      optional<std::array<double,_3UL>,_0>
                ((optional<std::array<double,_3UL>_> *)local_788,
                 (optional<std::array<double,_3UL>_> *)(val_22._M_elems + 2));
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)(val_22._M_elems + 2));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_788);
      if (bVar1) {
        pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                            ((optional<std::array<double,_3UL>_> *)local_788);
        pv_23.contained._16_8_ = pvVar13->_M_elems[0];
        val_22._M_elems[0] = pvVar13->_M_elems[1];
        val_22._M_elems[1] = pvVar13->_M_elems[2];
        Value::operator=(inout,(vector3d *)((long)&pv_23.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)local_788);
joined_r0x003bb00f:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_23.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)local_7f8,
                 (optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_23.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)&val_23.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_7f8);
      if (bVar1) {
        pvVar14 = nonstd::optional_lite::
                  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                           *)local_7f8);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_23.
                    super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar14);
        ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::vector
                  ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &pv_24);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_23.
                       super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::resize
                  ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &pv_24,sVar19);
        __dest_09 = ::std::
                    vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
                    data((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                          *)&pv_24);
        paVar15 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ::data((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          *)&newval_23.
                             super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_23.
                       super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_09,paVar15,sVar19 * 0x18);
        Value::operator=(inout,(vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                *)&pv_24);
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
        ~vector((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                &pv_24);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_23.
                    super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)local_7f8);
      goto joined_r0x003bb00f;
    }
  }
  uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::point3h>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_24.z,inout,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>
                (&local_850,(optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_24.z);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_24.z);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_850);
      if (bVar1) {
        pvVar7 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_850);
        pv_25.contained._20_4_ = *(undefined4 *)pvVar7->_M_elems;
        newval_24.y.value = pvVar7->_M_elems[2].value;
        Value::operator=(inout,(point3h *)((long)&pv_25.contained + 0x14));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_850);
joined_r0x003bb27b:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::
      get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_25.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)local_888,
                 (optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_25.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)&val_25.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_888);
      if (bVar1) {
        pvVar8 = nonstd::optional_lite::
                 optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                 ::value((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)local_888);
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&newval_25.
                     super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8);
        ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::vector
                  ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   ((long)&pv_26.contained + 4));
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_25.
                            super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::resize
                  ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   ((long)&pv_26.contained + 4),sVar19);
        __dest_10 = ::std::
                    vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
                    data((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                          *)((long)&pv_26.contained + 4));
        paVar9 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::data((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_25.
                            super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_25.
                            super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_10,paVar9,sVar19 * 6);
        Value::operator=(inout,(vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                *)((long)&pv_26.contained + 4));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::~vector
                  ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   ((long)&pv_26.contained + 4));
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)&newval_25.
                      super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)local_888);
      goto joined_r0x003bb27b;
    }
  }
  uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::point3f>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<float,3ul>>
                ((optional<std::array<float,_3UL>_> *)(val_26._M_elems + 1),inout,false);
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::optional<std::array<float,_3UL>,_0>
                ((optional<std::array<float,_3UL>_> *)local_8e8,
                 (optional<std::array<float,_3UL>_> *)(val_26._M_elems + 1));
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)(val_26._M_elems + 1));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_8e8);
      if (bVar1) {
        pvVar10 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                            ((optional<std::array<float,_3UL>_> *)local_8e8);
        pv_27.contained._16_8_ = *(undefined8 *)pvVar10->_M_elems;
        val_26._M_elems[0] = pvVar10->_M_elems[2];
        Value::operator=(inout,(point3f *)((long)&pv_27.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)local_8e8);
joined_r0x003bb4e7:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_27.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)local_930,
                 (optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_27.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)&val_27.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_930);
      if (bVar1) {
        pvVar11 = nonstd::optional_lite::
                  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           *)local_930);
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_27.
                    super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11);
        ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
                  ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   ((long)&pv_28.contained + 0x10));
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_27.
                       super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::resize
                  ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   ((long)&pv_28.contained + 0x10),sVar19);
        __dest_11 = ::std::
                    vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
                    data((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                          *)((long)&pv_28.contained + 0x10));
        paVar12 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &newval_27.
                        super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_27.
                       super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_11,paVar12,sVar19 * 0xc);
        Value::operator=(inout,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                *)((long)&pv_28.contained + 0x10));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::~vector
                  ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   ((long)&pv_28.contained + 0x10));
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_27.
                    super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)local_930);
      goto joined_r0x003bb4e7;
    }
  }
  uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::point3d>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<double,3ul>>
                ((optional<std::array<double,_3UL>_> *)(val_28._M_elems + 2),inout,false);
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::
      optional<std::array<double,_3UL>,_0>
                ((optional<std::array<double,_3UL>_> *)local_9a0,
                 (optional<std::array<double,_3UL>_> *)(val_28._M_elems + 2));
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)(val_28._M_elems + 2));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_9a0);
      if (bVar1) {
        pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                            ((optional<std::array<double,_3UL>_> *)local_9a0);
        pv_29.contained._16_8_ = pvVar13->_M_elems[0];
        val_28._M_elems[0] = pvVar13->_M_elems[1];
        val_28._M_elems[1] = pvVar13->_M_elems[2];
        Value::operator=(inout,(point3d *)((long)&pv_29.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)local_9a0);
joined_r0x003bb770:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_29.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)local_a10,
                 (optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_29.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)&val_29.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_a10);
      if (bVar1) {
        pvVar14 = nonstd::optional_lite::
                  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                           *)local_a10);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_29.
                    super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar14);
        ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::vector
                  ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &pv_30);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_29.
                       super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::resize
                  ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &pv_30,sVar19);
        __dest_12 = ::std::
                    vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
                    data((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                          *)&pv_30);
        paVar15 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ::data((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          *)&newval_29.
                             super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_29.
                       super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_12,paVar15,sVar19 * 0x18);
        Value::operator=(inout,(vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                *)&pv_30);
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::~vector
                  ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &pv_30);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_29.
                    super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)local_a10);
      goto joined_r0x003bb770;
    }
  }
  uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::color3h>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_30.b,inout,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>
                (&local_a68,(optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_30.b);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&newval_30.b);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_a68);
      if (bVar1) {
        pvVar7 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_a68);
        pv_31.contained._20_4_ = *(undefined4 *)pvVar7->_M_elems;
        newval_30.g.value = pvVar7->_M_elems[2].value;
        Value::operator=(inout,(color3h *)((long)&pv_31.contained + 0x14));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_a68);
joined_r0x003bb9dc:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::
      get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_31.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)local_aa0,
                 (optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)&val_31.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)&val_31.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_aa0);
      if (bVar1) {
        pvVar8 = nonstd::optional_lite::
                 optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                 ::value((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)local_aa0);
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&newval_31.
                     super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8);
        ::std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::vector
                  ((vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                   ((long)&pv_32.contained + 4));
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_31.
                            super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::resize
                  ((vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                   ((long)&pv_32.contained + 4),sVar19);
        __dest_13 = ::std::
                    vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::
                    data((vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                          *)((long)&pv_32.contained + 4));
        paVar9 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::data((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_31.
                            super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&newval_31.
                            super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_13,paVar9,sVar19 * 6);
        Value::operator=(inout,(vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                *)((long)&pv_32.contained + 4));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::~vector
                  ((vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                   ((long)&pv_32.contained + 4));
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)&newval_31.
                      super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)local_aa0);
      goto joined_r0x003bb9dc;
    }
  }
  uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::color3f>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<float,3ul>>
                ((optional<std::array<float,_3UL>_> *)(val_32._M_elems + 1),inout,false);
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::optional<std::array<float,_3UL>,_0>
                ((optional<std::array<float,_3UL>_> *)local_b00,
                 (optional<std::array<float,_3UL>_> *)(val_32._M_elems + 1));
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)(val_32._M_elems + 1));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_b00);
      if (bVar1) {
        pvVar10 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                            ((optional<std::array<float,_3UL>_> *)local_b00);
        pv_33.contained._16_8_ = *(undefined8 *)pvVar10->_M_elems;
        val_32._M_elems[0] = pvVar10->_M_elems[2];
        Value::operator=(inout,(color3f *)((long)&pv_33.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                ((optional<std::array<float,_3UL>_> *)local_b00);
joined_r0x003bbc48:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_33.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)local_b48,
                 (optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)&val_33.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)&val_33.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_b48);
      if (bVar1) {
        pvVar11 = nonstd::optional_lite::
                  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           *)local_b48);
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_33.
                    super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11);
        ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::vector
                  ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   ((long)&pv_34.contained + 0x10));
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_33.
                       super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::resize
                  ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   ((long)&pv_34.contained + 0x10),sVar19);
        __dest_14 = ::std::
                    vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
                    data((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                          *)((long)&pv_34.contained + 0x10));
        paVar12 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &newval_33.
                        super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &newval_33.
                       super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_14,paVar12,sVar19 * 0xc);
        Value::operator=(inout,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                *)((long)&pv_34.contained + 0x10));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::~vector
                  ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   ((long)&pv_34.contained + 0x10));
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &newval_33.
                    super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)local_b48);
      goto joined_r0x003bbc48;
    }
  }
  uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::color3d>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<double,3ul>>
                ((optional<std::array<double,_3UL>_> *)(val_34._M_elems + 2),inout,false);
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::
      optional<std::array<double,_3UL>,_0>
                ((optional<std::array<double,_3UL>_> *)local_bb8,
                 (optional<std::array<double,_3UL>_> *)(val_34._M_elems + 2));
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)(val_34._M_elems + 2));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_bb8);
      if (bVar1) {
        pvVar13 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                            ((optional<std::array<double,_3UL>_> *)local_bb8);
        pv_35.contained._16_8_ = pvVar13->_M_elems[0];
        val_34._M_elems[0] = pvVar13->_M_elems[1];
        val_34._M_elems[1] = pvVar13->_M_elems[2];
        Value::operator=(inout,(color3d *)((long)&pv_35.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                ((optional<std::array<double,_3UL>_> *)local_bb8);
joined_r0x003bbed1:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_35.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_0>
                ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)local_c28,
                 (optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  *)&val_35.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)&val_35.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_c28);
      if (bVar1) {
        pvVar14 = nonstd::optional_lite::
                  optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                  ::value((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                           *)local_c28);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_35.
                    super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar14);
        ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::vector
                  ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &pv_36.contained);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_35.
                       super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::resize
                  ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &pv_36.contained,sVar19);
        __dest_15 = ::std::
                    vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
                    data((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                          *)&pv_36.contained);
        paVar15 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ::data((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          *)&newval_35.
                             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 size((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      &newval_35.
                       super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_15,paVar15,sVar19 * 0x18);
        Value::operator=(inout,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                *)&pv_36.contained);
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::~vector
                  ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &pv_36.contained);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &newval_35.
                    super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                 *)local_c28);
      goto joined_r0x003bbed1;
    }
  }
  uVar3 = TypeTraits<std::array<tinyusdz::value::half,_4UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::color4h>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<tinyusdz::value::half,4ul>>
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)&val_36,inout,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::
      optional<std::array<tinyusdz::value::half,_4UL>,_0>
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_c82,
                 (optional<std::array<tinyusdz::value::half,_4UL>_> *)&val_36);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)&val_36);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_c82);
      if (bVar1) {
        pvVar16 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::value
                            ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_c82);
        unique0x00012000 = *(undefined8 *)pvVar16->_M_elems;
        Value::operator=(inout,(color4h *)((long)&pv_37.contained + 0x14));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_c82);
joined_r0x003bc12b:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<tinyusdz::value::half,_4UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::
      get_value<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                ((optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
                  *)&val_37.
                     super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
      ::
      optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>,_0>
                ((optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
                  *)local_cc0,
                 (optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
                  *)&val_37.
                     super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
                   *)&val_37.
                      super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_cc0);
      if (bVar1) {
        __x_02 = nonstd::optional_lite::
                 optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
                 ::value((optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
                          *)local_cc0);
        ::std::
        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)&newval_37.
                     super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,__x_02);
        ::std::vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::vector
                  ((vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                   ((long)&pv_38.contained + 8));
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                         *)&newval_37.
                            super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::resize
                  ((vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                   ((long)&pv_38.contained + 8),sVar19);
        __dest_16 = ::std::
                    vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::
                    data((vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                          *)((long)&pv_38.contained + 8));
        __src_02 = ::std::
                   vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                   ::data((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                           *)&newval_37.
                              super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::
                 vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                 ::size((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                         *)&newval_37.
                            super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_16,__src_02,sVar19 << 3);
        Value::operator=(inout,(vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                *)((long)&pv_38.contained + 8));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::~vector
                  ((vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                   ((long)&pv_38.contained + 8));
        ::std::
        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                   *)&newval_37.
                      super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
      ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
                   *)local_cc0);
      goto joined_r0x003bc12b;
    }
  }
  uVar3 = TypeTraits<std::array<float,_4UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::color4f>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<float,4ul>>
                ((optional<std::array<float,_4UL>_> *)(val_38._M_elems + 2),inout,false);
      nonstd::optional_lite::optional<std::array<float,_4UL>_>::optional<std::array<float,_4UL>,_0>
                ((optional<std::array<float,_4UL>_> *)local_d24,
                 (optional<std::array<float,_4UL>_> *)(val_38._M_elems + 2));
      nonstd::optional_lite::optional<std::array<float,_4UL>_>::~optional
                ((optional<std::array<float,_4UL>_> *)(val_38._M_elems + 2));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_d24);
      if (bVar1) {
        pvVar17 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                            ((optional<std::array<float,_4UL>_> *)local_d24);
        pv_39.contained._16_8_ = *(undefined8 *)pvVar17->_M_elems;
        val_38._M_elems._0_8_ = *(undefined8 *)(pvVar17->_M_elems + 2);
        Value::operator=(inout,(color4f *)((long)&pv_39.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<float,_4UL>_>::~optional
                ((optional<std::array<float,_4UL>_> *)local_d24);
joined_r0x003bc39e:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<float,_4UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                ((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                  *)&val_39.
                     super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::
      optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>,_0>
                ((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                  *)local_d78,
                 (optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                  *)&val_39.
                     super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                 *)&val_39.
                    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_d78);
      if (bVar1) {
        __x_03 = nonstd::optional_lite::
                 optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                 ::value((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                          *)local_d78);
        ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
                  ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &newval_39.
                    super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x_03);
        ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::vector
                  ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   ((long)&pv_40.contained + 0x18));
        sVar19 = ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
                 size((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                      &newval_39.
                       super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::resize
                  ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   ((long)&pv_40.contained + 0x18),sVar19);
        __dest_17 = ::std::
                    vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
                    data((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                          *)((long)&pv_40.contained + 0x18));
        __src_03 = ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
                   data((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                        &newval_39.
                         super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
                 size((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                      &newval_39.
                       super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_17,__src_03,sVar19 << 4);
        Value::operator=(inout,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                *)((long)&pv_40.contained + 0x18));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::~vector
                  ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   ((long)&pv_40.contained + 0x18));
        ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::~vector
                  ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &newval_39.
                    super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::
      ~optional((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                 *)local_d78);
      goto joined_r0x003bc39e;
    }
  }
  uVar3 = TypeTraits<std::array<double,_4UL>_>::type_id();
  if (uVar2 == uVar3) {
    uVar3 = TypeTraits<tinyusdz::value::color4d>::type_id();
    if (roleTyId == uVar3) {
      Value::get_value<std::array<double,4ul>>
                ((optional<std::array<double,_4UL>_> *)(val_40._M_elems + 3),inout,false);
      nonstd::optional_lite::optional<std::array<double,_4UL>_>::
      optional<std::array<double,_4UL>,_0>
                ((optional<std::array<double,_4UL>_> *)local_df0,
                 (optional<std::array<double,_4UL>_> *)(val_40._M_elems + 3));
      nonstd::optional_lite::optional<std::array<double,_4UL>_>::~optional
                ((optional<std::array<double,_4UL>_> *)(val_40._M_elems + 3));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_df0);
      if (bVar1) {
        pvVar18 = nonstd::optional_lite::optional<std::array<double,_4UL>_>::value
                            ((optional<std::array<double,_4UL>_> *)local_df0);
        pv_41.contained._16_8_ = pvVar18->_M_elems[0];
        val_40._M_elems[0] = pvVar18->_M_elems[1];
        val_40._M_elems[1] = pvVar18->_M_elems[2];
        val_40._M_elems[2] = pvVar18->_M_elems[3];
        Value::operator=(inout,(color4d *)((long)&pv_41.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<double,_4UL>_>::~optional
                ((optional<std::array<double,_4UL>_> *)local_df0);
joined_r0x003bc646:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<std::array<double,_4UL>_>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar3 = TypeTraits<std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>_>
                ::type_id(), roleTyId == uVar3)) {
      Value::get_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                ((optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                  *)&val_41.
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>::
      optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>,_0>
                ((optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                  *)local_e78,
                 (optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                  *)&val_41.
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                 *)&val_41.
                    super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_e78);
      if (bVar1) {
        __x_04 = nonstd::optional_lite::
                 optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                 ::value((optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                          *)local_e78);
        ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &newval_41.
                    super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x_04);
        ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::vector
                  ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   ((long)&pv_42.contained + 0x78));
        sVar19 = ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
                 size((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                      &newval_41.
                       super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::resize
                  ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   ((long)&pv_42.contained + 0x78),sVar19);
        __dest_18 = ::std::
                    vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
                    data((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                          *)((long)&pv_42.contained + 0x78));
        __src_04 = ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                   ::data((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                           *)&newval_41.
                              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
                 size((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                      &newval_41.
                       super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_18,__src_04,sVar19 << 5);
        Value::operator=(inout,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                *)((long)&pv_42.contained + 0x78));
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::~vector
                  ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   ((long)&pv_42.contained + 0x78));
        ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::~vector
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &newval_41.
                    super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>::
      ~optional((optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                 *)local_e78);
      goto joined_r0x003bc646;
    }
  }
  uVar3 = TypeTraits<tinyusdz::value::matrix4d>::type_id();
  if (uVar2 == uVar3) {
    uVar2 = TypeTraits<tinyusdz::value::frame4d>::type_id();
    if (roleTyId == uVar2) {
      Value::get_value<tinyusdz::value::matrix4d>
                ((optional<tinyusdz::value::matrix4d> *)(val_42.m[3] + 3),inout,false);
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::
      optional<tinyusdz::value::matrix4d,_0>
                ((optional<tinyusdz::value::matrix4d> *)local_f50,
                 (optional<tinyusdz::value::matrix4d> *)(val_42.m[3] + 3));
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional
                ((optional<tinyusdz::value::matrix4d> *)(val_42.m[3] + 3));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_f50);
      if (bVar1) {
        __src_05 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value
                             ((optional<tinyusdz::value::matrix4d> *)local_f50);
        memcpy(newval_42.m[3] + 3,__src_05,0x80);
        frame4d::frame4d((frame4d *)((long)&pv_43.contained + 0x10));
        memcpy((void *)((long)&pv_43.contained + 0x10),newval_42.m[3] + 3,0x80);
        Value::operator=(inout,(frame4d *)((long)&pv_43.contained + 0x10));
        inout_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional
                ((optional<tinyusdz::value::matrix4d> *)local_f50);
joined_r0x003bc8c0:
      if (pv_1.contained._20_4_ != 0) goto LAB_003bc8d0;
    }
  }
  else {
    uVar3 = TypeTraits<tinyusdz::value::matrix4d>::type_id();
    if ((uVar2 == (uVar3 | 0x100000)) &&
       (uVar2 = TypeTraits<std::vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>_>
                ::type_id(), roleTyId == uVar2)) {
      Value::
      get_value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                ((optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                  *)&val_43.
                     super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,inout,false);
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
      ::
      optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>,_0>
                ((optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                  *)local_10f8,
                 (optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                  *)&val_43.
                     super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
      ::~optional((optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                   *)&val_43.
                      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_10f8);
      if (bVar1) {
        __x_05 = nonstd::optional_lite::
                 optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 ::value((optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                          *)local_10f8);
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                  ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   &newval_43.
                    super__Vector_base<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x_05);
        ::std::vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>::vector
                  ((vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_> *)
                   local_1148);
        sVar19 = ::std::
                 vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::size
                           ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                             *)&newval_43.
                                super__Vector_base<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>::resize
                  ((vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_> *)
                   local_1148,sVar19);
        __dest_19 = ::std::
                    vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>::
                    data((vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>
                          *)local_1148);
        __src_06 = ::std::
                   vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
                   data((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         *)&newval_43.
                            super__Vector_base<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = ::std::
                 vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::size
                           ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                             *)&newval_43.
                                super__Vector_base<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(__dest_19,__src_06,sVar19 << 7);
        Value::operator=(inout,(vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>
                                *)local_1148);
        inout_local._7_1_ = 1;
        pv_1.contained._20_4_ = 1;
        ::std::vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>::~vector
                  ((vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_> *)
                   local_1148);
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
        ~vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                &newval_43.
                 super__Vector_base<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pv_1.contained._20_4_ = 0;
      }
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
      ::~optional((optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                   *)local_10f8);
      goto joined_r0x003bc8c0;
    }
  }
  inout_local._7_1_ = 0;
LAB_003bc8d0:
  return (bool)(inout_local._7_1_ & 1);
}

Assistant:

bool RoleTypeCast(const uint32_t roleTyId, value::Value &inout) {
  const uint32_t srcUnderlyingTyId = inout.underlying_type_id();

  DCOUT("input type = " << inout.type_name());

  // scalar and array
#define ROLE_TYPE_CAST(__roleTy, __srcBaseTy)                                  \
  {                                                                            \
    static_assert(value::TypeTraits<__roleTy>::size() ==                       \
                      value::TypeTraits<__srcBaseTy>::size(),                  \
                  "");                                                         \
    if (srcUnderlyingTyId == value::TypeTraits<__srcBaseTy>::type_id()) {      \
      if (roleTyId == value::TypeTraits<__roleTy>::type_id()) {                \
        if (auto pv = inout.get_value<__srcBaseTy>()) {                        \
          __srcBaseTy val = pv.value();                                        \
          __roleTy newval;                                                     \
          memcpy(reinterpret_cast<__srcBaseTy *>(&newval), &val, sizeof(__srcBaseTy));                          \
          inout = newval;                                                      \
          return true;                                                         \
        }                                                                      \
      }                                                                        \
    } else if (srcUnderlyingTyId ==                                            \
               (value::TypeTraits<__srcBaseTy>::type_id() |                    \
                value::TYPE_ID_1D_ARRAY_BIT)) {                                \
      if (roleTyId == value::TypeTraits<std::vector<__roleTy>>::type_id()) {   \
        if (auto pv = inout.get_value<std::vector<__srcBaseTy>>()) {           \
          std::vector<__srcBaseTy> val = pv.value();                           \
          std::vector<__roleTy> newval;                                        \
          newval.resize(val.size());                                           \
          memcpy(reinterpret_cast<__srcBaseTy *>(newval.data()), val.data(), sizeof(__srcBaseTy) * val.size()); \
          inout = newval;                                                      \
          return true;                                                         \
        }                                                                      \
      }                                                                        \
    }                                                                          \
  }

  ROLE_TYPE_CAST(value::texcoord2h, value::half2)
  ROLE_TYPE_CAST(value::texcoord2f, value::float2)
  ROLE_TYPE_CAST(value::texcoord2d, value::double2)

  ROLE_TYPE_CAST(value::texcoord3h, value::half3)
  ROLE_TYPE_CAST(value::texcoord3f, value::float3)
  ROLE_TYPE_CAST(value::texcoord3d, value::double3)

  ROLE_TYPE_CAST(value::normal3h, value::half3)
  ROLE_TYPE_CAST(value::normal3f, value::float3)
  ROLE_TYPE_CAST(value::normal3d, value::double3)

  ROLE_TYPE_CAST(value::vector3h, value::half3)
  ROLE_TYPE_CAST(value::vector3f, value::float3)
  ROLE_TYPE_CAST(value::vector3d, value::double3)

  ROLE_TYPE_CAST(value::point3h, value::half3)
  ROLE_TYPE_CAST(value::point3f, value::float3)
  ROLE_TYPE_CAST(value::point3d, value::double3)

  ROLE_TYPE_CAST(value::color3h, value::half3)
  ROLE_TYPE_CAST(value::color3f, value::float3)
  ROLE_TYPE_CAST(value::color3d, value::double3)

  ROLE_TYPE_CAST(value::color4h, value::half4)
  ROLE_TYPE_CAST(value::color4f, value::float4)
  ROLE_TYPE_CAST(value::color4d, value::double4)

  ROLE_TYPE_CAST(value::frame4d, value::matrix4d)

#undef ROLE_TYPE_CAST

  return false;
}